

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

int bucket_alloc_pairs(bucket b,size_t capacity)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    log_write_impl_va("metacall",0x95,"bucket_alloc_pairs",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,"Invalid bucket");
    local_4 = 1;
  }
  else if (in_RDI[2] == 0) {
    pvVar1 = malloc(in_RSI << 4);
    in_RDI[2] = pvVar1;
    if (in_RDI[2] == 0) {
      log_write_impl_va("metacall",0xa3,"bucket_alloc_pairs",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                        ,3,"Bad pairs allocation");
      local_4 = 1;
    }
    else {
      *in_RDI = 0;
      in_RDI[1] = in_RSI;
      local_4 = 0;
    }
  }
  else {
    log_write_impl_va("metacall",0x9b,"bucket_alloc_pairs",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,"Set bucket pairs already allocated");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int bucket_alloc_pairs(bucket b, size_t capacity)
{
	if (b == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket");
		return 1;
	}

	if (b->pairs != NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Set bucket pairs already allocated");
		return 1;
	}

	b->pairs = malloc(sizeof(struct pair_type) * capacity);

	if (b->pairs == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad pairs allocation");
		return 1;
	}

	b->count = 0;
	b->capacity = capacity;

	return 0;
}